

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::announce_with_tracker(torrent *this,event_t e)

{
  _Atomic_word *p_Var1;
  int *piVar2;
  header_holder_type *phVar3;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *__r;
  string *this_00;
  uint *puVar4;
  byte bVar5;
  byte fail_limit;
  ushort uVar6;
  node_ptr plVar7;
  pointer pppVar8;
  element_type *peVar9;
  element_type *peVar10;
  session_interface *psVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  announce_protocol_state aVar14;
  long *plVar15;
  pointer paVar16;
  element_type *peVar17;
  _Alloc_hider _Var18;
  context *pcVar19;
  bool bVar20;
  bool bVar21;
  uint uVar22;
  int iVar23;
  time_point32 now;
  uint32_t uVar24;
  uint uVar25;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  pointer paVar26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var27;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  event_t eVar28;
  _func_int *UNRECOVERED_JUMPTABLE;
  pointer this_01;
  long lVar29;
  pointer paVar30;
  pointer paVar31;
  uint extraout_EDX;
  endpoint *ep;
  endpoint *ep_00;
  peer_connection **c;
  pointer pppVar32;
  torrent *ptVar33;
  ulong uVar34;
  char *pcVar35;
  ulong uVar36;
  ulong uVar37;
  pointer paVar38;
  long lVar39;
  optional<long> oVar40;
  protocol_version ih;
  torrent *local_470;
  shared_ptr<libtorrent::aux::tracker_logger> tl;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  announce_entry *local_448;
  ulong local_440;
  array<const_bool,_num_protocols,_protocol_version> supports_protocol;
  uint local_40c;
  vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
  listen_socket_states;
  element_type *local_3b8;
  long *local_3b0;
  element_type *local_3a8;
  long *local_3a0;
  string *local_398;
  __weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *local_390;
  pointer local_388;
  pointer local_380;
  undefined1 local_378 [16];
  tracker_request req;
  torrent *local_260;
  tracker_request *local_258;
  service_type *local_250;
  time_type local_248;
  undefined1 local_240 [176];
  object_fns *local_190;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_158;
  tracker_request local_138;
  
  phVar3 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header;
  plVar7 = (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.next_;
  if (plVar7 == (node_ptr)0x0 || plVar7 == &phVar3->super_node) {
    UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
    pcVar35 = "*** announce: no trackers";
  }
  else {
    uVar22 = (uint)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48;
    if (e == stopped || (uVar22 >> 0x1a & 1) != 0) {
      iVar23 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      req.url._M_dataplus._M_p = (pointer)(CONCAT44(extraout_var,iVar23) + 0x438);
      req.url._M_string_length = req.url._M_string_length & 0xffffffffffffff00;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&req);
      req.url._M_string_length = CONCAT71(req.url._M_string_length._1_7_,1);
      iVar23 = *(int *)(CONCAT44(extraout_var,iVar23) + 0x1b0);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&req);
      e = stopped;
      if (iVar23 < 1) {
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"*** announce: event == stopped && stop_tracker_timeout <= 0");
        return;
      }
LAB_0031401d:
      req.url._M_dataplus._M_p = (pointer)&req.url.field_2;
      req.url._M_string_length = 0;
      req.url.field_2._M_local_buf[0] = '\0';
      req.trackerid._M_dataplus._M_p = (pointer)&req.trackerid.field_2;
      req.trackerid._M_string_length = 0;
      req.trackerid.field_2._M_local_buf[0] = '\0';
      req.filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      req.filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      req.downloaded = -1;
      req.uploaded = -1;
      req.left = -1;
      req.corrupt = 0;
      req.redundant._0_4_ = 0;
      req.redundant._4_4_ = 0;
      req.listen_port = 0;
      req.event = none;
      req.kind.m_val = '\0';
      req.key = 0;
      req.num_want = 0;
      req.ipv6.
      super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      req.ipv6.
      super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      req.ipv6.
      super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      req.ipv4.
      super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      req.ipv4.
      super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      req.ipv4.
      super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      req.info_hash.m_number._M_elems[0] = 0;
      req.info_hash.m_number._M_elems[1] = 0;
      req.info_hash.m_number._M_elems[2] = 0;
      req.info_hash.m_number._M_elems[3] = 0;
      req.info_hash.m_number._M_elems[4] = 0;
      req.pid.m_number._M_elems[0] = 0;
      req.pid.m_number._M_elems[1] = 0;
      req.pid.m_number._M_elems[2] = 0;
      req.pid.m_number._M_elems[3] = 0;
      req.pid.m_number._M_elems[4] = 0;
      req.outgoing_socket.m_sock.
      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
           0;
      req.outgoing_socket.m_sock.
      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_6_ =
           0;
      req.outgoing_socket.m_sock.
      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._0_2_ = 0;
      req.outgoing_socket.m_sock.
      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._2_6_ = 0;
      req.private_torrent = false;
      req.triggered_manually = false;
      req.ssl_ctx = (context *)0x0;
      req.i2pconn = (i2p_connection *)0x0;
      iVar23 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(CONCAT44(extraout_var_00,iVar23) + 0x438);
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_1_ = 0;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_1_ = 1;
      uVar36 = *(ulong *)(CONCAT44(extraout_var_00,iVar23) + 0x428);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
      if (((uVar36 >> 0x2e & 1) != 0) && ((this->field_0x5db & 2) != 0)) {
        req.filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (this->m_ip_filter).
                 super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&req.filter.
                    super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(this->m_ip_filter).
                    super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      req.private_torrent =
           (bool)((((this->super_torrent_hot_members).m_torrent_file.
                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_flags).m_val >> 1 & 1);
      uVar12 = *(undefined8 *)(this->m_peer_id).m_number._M_elems;
      uVar13 = *(undefined8 *)((this->m_peer_id).m_number._M_elems + 2);
      req.pid.m_number._M_elems[0] = (uint)uVar12;
      req.pid.m_number._M_elems[1] = (uint)((ulong)uVar12 >> 0x20);
      req.pid.m_number._M_elems[2] = (uint)uVar13;
      req.pid.m_number._M_elems[3] = (uint)((ulong)uVar13 >> 0x20);
      req.pid.m_number._M_elems[4] = (this->m_peer_id).m_number._M_elems[4];
      req.corrupt = this->m_total_failed_bytes;
      req.downloaded =
           *(long *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                     field_0x20 - req.corrupt;
      req.uploaded = *(int64_t *)
                      &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>;
      oVar40 = bytes_left(this);
      req.left = 0x4000;
      if (((undefined1  [16])
           oVar40.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        req.left = oVar40.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload;
      }
      req.ssl_ctx = (this->m_ssl_ctx)._M_t.
                    super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
                    .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl;
      req.redundant._0_4_ = (undefined4)this->m_total_redundant_bytes;
      req.redundant._4_4_ = (undefined4)((ulong)this->m_total_redundant_bytes >> 0x20);
      iVar23 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(CONCAT44(extraout_var_01,iVar23) + 0x438);
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_1_ = 0;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_1_ = 1;
      uVar22 = *(uint *)(CONCAT44(extraout_var_01,iVar23) + 0x428);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
      lVar39 = req.downloaded;
      if ((uVar22 >> 0x1d & 1) == 0) {
        lVar39 = req.downloaded - this->m_total_redundant_bytes;
        req.downloaded = lVar39;
        bVar20 = is_seed(this);
        if (bVar20) {
          pppVar8 = (this->super_torrent_hot_members).m_connections.
                    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    .
                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pppVar32 = (this->super_torrent_hot_members).m_connections.
                          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          .
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; pppVar32 != pppVar8;
              pppVar32 = pppVar32 + 1) {
            (*((*pppVar32)->super_bandwidth_socket)._vptr_bandwidth_socket[0x1c])();
            if (0 < (int)extraout_EDX) {
              req.downloaded = req.downloaded - (ulong)(extraout_EDX & 0x7fffffff);
              req.redundant = req.redundant + (ulong)(extraout_EDX & 0x7fffffff);
            }
            lVar39 = req.downloaded;
          }
        }
      }
      if (lVar39 < 0) {
        req.downloaded = 0;
      }
      req.event = e;
      iVar23 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(CONCAT44(extraout_var_02,iVar23) + 0x438);
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_1_ = 0;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
      tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_1_ = 1;
      uVar36 = *(ulong *)(CONCAT44(extraout_var_02,iVar23) + 0x428);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
      if ((((uVar36 >> 0x26 & 1) == 0) &&
          (peVar9 = (this->super_torrent_hot_members).m_torrent_file.
                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
          peVar9 != (element_type *)0x0)) && (((peVar9->m_flags).m_val & 2) != 0)) {
        local_258 = &req;
        local_248.__d.__r =
             (duration)
             ::std::
             _Function_handler<void_(const_libtorrent::aux::listen_socket_handle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3082:33)>
             ::_M_invoke;
        local_250 = (service_type *)
                    ::std::
                    _Function_handler<void_(const_libtorrent::aux::listen_socket_handle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3082:33)>
                    ::_M_manager;
        local_260 = this;
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x24])();
        if (local_250 != (service_type *)0x0) {
          (*(code *)local_250)(&local_260,&local_260,3);
        }
      }
      iVar23 = 0;
      if (req.event != stopped) {
        iVar23 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(CONCAT44(extraout_var_03,iVar23) + 0x438);
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_1_ = 0;
        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_1_ = 1;
        iVar23 = *(int *)(CONCAT44(extraout_var_03,iVar23) + 0x200);
        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
      }
      req.num_want = iVar23;
      bVar20 = digest32<160L>::is_all_zeros(&(this->m_info_hash).v1);
      bVar21 = digest32<256L>::is_all_zeros(&(this->m_info_hash).v2);
      supports_protocol.super_array<const_bool,_2UL>._M_elems[1] = !bVar21;
      supports_protocol.super_array<const_bool,_2UL>._M_elems[0] = !bVar20;
      now = time_now32();
      listen_socket_states.
      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      listen_socket_states.
      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      listen_socket_states.
      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar23 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
      if ((char)iVar23 != '\0') {
        iVar23 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(CONCAT44(extraout_var_04,iVar23) + 0x438);
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_1_ = 0;
        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_1_ = 1;
        uVar22 = *(uint *)(CONCAT44(extraout_var_04,iVar23) + 0x428);
        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
        iVar23 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(CONCAT44(extraout_var_05,iVar23) + 0x438);
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_1_ = 0;
        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
        tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_1_ = 1;
        uVar25 = *(uint *)(CONCAT44(extraout_var_05,iVar23) + 0x428);
        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,
                   "*** announce: [ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
                   ,(ulong)(uVar22 >> 0x11 & 1),(ulong)(uVar25 >> 0x12 & 1),
                   (ulong)(uint)(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.
                                super_size_traits.size_);
      }
      local_448 = (announce_entry *)(phVar3->super_node).next_;
      if (local_448 != (announce_entry *)phVar3) {
        local_398 = &this->m_trackerid;
        local_390 = (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                    &this->super_enable_shared_from_this<libtorrent::aux::torrent>;
        local_40c = 0xffffffff;
        local_470 = this;
        do {
          anon_unknown_135::refresh_endpoint_list
                    ((this->super_torrent_hot_members).m_ses,
                     (bool)((byte)((uint)*(undefined4 *)&this->field_0x5dd >> 0x19) & 1),
                     (bool)((byte)this->field_0x606 >> 6 & 1),local_448);
          ::std::__cxx11::string::_M_assign((string *)&req.trackerid);
          ::std::__cxx11::string::_M_assign((string *)&req);
          bVar20 = is_i2p_url((string *)&req);
          local_40c = local_40c + 1;
          if (bVar20) {
            req.kind.m_val = req.kind.m_val | 2;
LAB_0031459f:
            this_01 = (local_448->endpoints).
                      super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_388 = (local_448->endpoints).
                        super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            if (this_01 != local_388) {
              do {
                paVar30 = listen_socket_states.
                          super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                paVar31 = listen_socket_states.
                          super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                __r = &(this_01->socket).m_sock.
                       super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount;
                p_Var27 = (this_01->socket).m_sock.
                          super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
                uVar37 = (long)listen_socket_states.
                               super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)listen_socket_states.
                               super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                paVar26 = listen_socket_states.
                          super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar36 = uVar37;
                if (0 < (long)uVar37 >> 7) {
                  paVar26 = (pointer)((long)&(((announce_state *)
                                              (&(listen_socket_states.
                                                 super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->state +
                                              -1))->socket).m_sock.
                                             super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (uVar37 & 0xffffffffffffff80));
                  lVar39 = ((long)uVar37 >> 7) + 1;
                  paVar38 = listen_socket_states.
                            super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                            ._M_impl.super__Vector_impl_data._M_start + 2;
                  do {
                    if (paVar38[-2].socket.m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi == p_Var27) {
                      paVar38 = paVar38 + -2;
                      goto LAB_0031467d;
                    }
                    if (paVar38[-1].socket.m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi == p_Var27) {
                      paVar38 = paVar38 + -1;
                      goto LAB_0031467d;
                    }
                    if ((paVar38->socket).m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi == p_Var27) goto LAB_0031467d;
                    if (paVar38[1].socket.m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi == p_Var27) {
                      paVar38 = paVar38 + 1;
                      goto LAB_0031467d;
                    }
                    lVar39 = lVar39 + -1;
                    paVar38 = paVar38 + 4;
                  } while (1 < lVar39);
                  uVar36 = (long)listen_socket_states.
                                 super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar26;
                }
                lVar39 = (long)uVar36 >> 5;
                if (lVar39 == 1) {
LAB_00314660:
                  paVar38 = paVar26;
                  if ((paVar26->socket).m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != p_Var27) {
                    paVar38 = listen_socket_states.
                              super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
LAB_0031467d:
                  if (paVar38 ==
                      listen_socket_states.
                      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00314686;
                }
                else {
                  if (lVar39 == 2) {
LAB_00314656:
                    paVar38 = paVar26;
                    if ((paVar26->socket).m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != p_Var27) {
                      paVar26 = paVar26 + 1;
                      goto LAB_00314660;
                    }
                    goto LAB_0031467d;
                  }
                  if (lVar39 == 3) {
                    paVar38 = paVar26;
                    if ((paVar26->socket).m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != p_Var27) {
                      paVar26 = paVar26 + 1;
                      goto LAB_00314656;
                    }
                    goto LAB_0031467d;
                  }
LAB_00314686:
                  if (listen_socket_states.
                      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                      ._M_impl.super__Vector_impl_data._M_finish ==
                      listen_socket_states.
                      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    if (uVar37 == 0x7fffffffffffffe0) {
                      ::std::__throw_length_error("vector::_M_realloc_insert");
                    }
                    uVar37 = (long)uVar37 >> 5;
                    uVar36 = uVar37;
                    if (listen_socket_states.
                        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                        listen_socket_states.
                        super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
                      uVar36 = 1;
                    }
                    uVar34 = uVar36 + uVar37;
                    if (0x3fffffffffffffe < uVar34) {
                      uVar34 = 0x3ffffffffffffff;
                    }
                    if (CARRY8(uVar36,uVar37)) {
                      uVar34 = 0x3ffffffffffffff;
                    }
                    if (uVar34 == 0) {
                      paVar26 = (pointer)0x0;
                    }
                    else {
                      paVar26 = (pointer)operator_new(uVar34 << 5);
                      p_Var27 = __r->_M_pi;
                    }
                    peVar10 = (this_01->socket).m_sock.
                              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr;
                    if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var27->_M_weak_count = p_Var27->_M_weak_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var27->_M_weak_count = p_Var27->_M_weak_count + 1;
                      }
                    }
                    paVar26[uVar37].socket.m_sock.
                    super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = peVar10;
                    paVar26[uVar37].socket.m_sock.
                    super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = p_Var27;
                    lVar39 = 0;
                    do {
                      *(undefined4 *)
                       ((long)&paVar26[uVar37].state.
                               super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                               ._M_elems[0].tier + lVar39) = 0x7fffffff;
                      *(undefined2 *)
                       (&paVar26[uVar37].state.
                         super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                         ._M_elems[0].sent_announce + lVar39) = 0;
                      lVar39 = lVar39 + 8;
                      paVar38 = paVar26;
                      paVar16 = paVar31;
                    } while (lVar39 != 0x10);
                    for (; paVar30 != paVar16; paVar16 = paVar16 + 1) {
                      p_Var27 = (paVar16->socket).m_sock.
                                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
                      (paVar38->socket).m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (paVar16->socket).m_sock.
                                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr;
                      (paVar38->socket).m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi = p_Var27;
                      (paVar16->socket).m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                           = (__weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                              )0x0;
                      aVar14 = (paVar16->state).
                               super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                               ._M_elems[1];
                      (paVar38->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[0] = (paVar16->state).
                                     super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                                     ._M_elems[0];
                      (paVar38->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[1] = aVar14;
                      paVar38 = paVar38 + 1;
                    }
                    if (paVar31 != (pointer)0x0) {
                      operator_delete(paVar31,(long)listen_socket_states.
                                                                                                        
                                                  super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              - (long)paVar31);
                    }
                    listen_socket_states.
                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                    ._M_impl.super__Vector_impl_data._M_start = paVar26;
                    listen_socket_states.
                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                    ._M_impl.super__Vector_impl_data._M_finish = paVar38 + 1;
                    listen_socket_states.
                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = paVar26 + uVar34;
                    this = local_470;
                  }
                  else {
                    peVar10 = (this_01->socket).m_sock.
                              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr;
                    if (p_Var27 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var27->_M_weak_count = p_Var27->_M_weak_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var27->_M_weak_count = p_Var27->_M_weak_count + 1;
                      }
                    }
                    ((listen_socket_states.
                      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->socket).m_sock.
                    super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = peVar10;
                    ((listen_socket_states.
                      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->socket).m_sock.
                    super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = p_Var27;
                    lVar39 = 0;
                    do {
                      *(undefined4 *)
                       ((long)&((listen_socket_states.
                                 super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->state).
                               super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                               ._M_elems[0].tier + lVar39) = 0x7fffffff;
                      *(undefined2 *)
                       (&((listen_socket_states.
                           super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->state).
                         super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                         ._M_elems[0].sent_announce + lVar39) = 0;
                      lVar39 = lVar39 + 8;
                    } while (lVar39 != 0x10);
                    listen_socket_states.
                    super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         listen_socket_states.
                         super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                    paVar38 = paVar30;
                  }
                }
                if ((this_01->field_0xb0 & 1) != 0) {
                  lVar39 = 0;
                  do {
                    ih = (&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar39];
                    uVar36 = (ulong)ih;
                    if (((supports_protocol.super_array<const_bool,_2UL>._M_elems[uVar36] != true)
                        || ((local_440 = uVar36,
                            ((this_01->info_hashes).
                             super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[uVar36].
                             field_0x45 & 1) == 0 && (req.event == stopped)))) ||
                       ((paVar38->state).
                        super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                        ._M_elems[uVar36].done != false)) goto LAB_00315325;
                    iVar23 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
                    this_00 = &(this_01->info_hashes).
                               super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems[uVar36]
                               .message;
                    if ((char)iVar23 != '\0') {
                      print_endpoint_abi_cxx11_((string *)&tl,(aux *)this_01,ep);
                      uVar36 = local_440;
                      peVar17 = tl.
                                super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr;
                      ptVar33 = local_470;
                      local_380 = (local_448->url)._M_dataplus._M_p;
                      bVar5 = local_448->tier;
                      uVar22 = (paVar38->state).
                               super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                               ._M_elems[local_440].tier;
                      uVar6 = *(ushort *)((long)(this_00 + 2) + 4);
                      fail_limit = local_448->fail_limit;
                      bVar20 = is_seed(local_470);
                      bVar20 = announce_infohash::can_announce
                                         ((announce_infohash *)this_00,
                                          (time_point)((long)(int)now.__d.__r * 1000000000),bVar20,
                                          fail_limit);
                      (*(ptVar33->super_request_callback)._vptr_request_callback[7])
                                (ptVar33,
                                 "*** tracker:  (%d) [ep: %s ] \"%s\" [  i->tier: %d tier: %d working: %d limit: %d can: %d sent: %d ]"
                                 ,(ulong)local_40c,peVar17,local_380,(ulong)bVar5,(ulong)uVar22,
                                 (ulong)((uVar6 & 0x7f) == 0),(ulong)fail_limit,(ulong)bVar20,
                                 (ulong)(paVar38->state).
                                        super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                                        ._M_elems[uVar36].sent_announce);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)tl.
                             super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr != &local_458) {
                        operator_delete(tl.
                                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr,local_458._M_allocated_capacity + 1);
                      }
                    }
                    iVar23 = (*(((local_470->super_torrent_hot_members).m_ses)->super_session_logger
                               )._vptr_session_logger[0x2e])();
                    tl.
                    super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)(CONCAT44(extraout_var_07,iVar23) + 0x438);
                    tl.
                    super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._0_1_ = 0;
                    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
                    tl.
                    super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._0_1_ = 1;
                    uVar22 = *(uint *)(CONCAT44(extraout_var_07,iVar23) + 0x428);
                    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
                    if ((uVar22 >> 0x11 & 1) != 0) {
                      iVar23 = (*(((local_470->super_torrent_hot_members).m_ses)->
                                 super_session_logger)._vptr_session_logger[0x2e])();
                      tl.
                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)(CONCAT44(extraout_var_08,iVar23) + 0x438);
                      tl.
                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._0_1_ = 0;
                      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
                      tl.
                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._0_1_ = 1;
                      uVar22 = *(uint *)(CONCAT44(extraout_var_08,iVar23) + 0x428);
                      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
                      if ((((uVar22 >> 0x12 & 1) == 0) &&
                          ((paVar38->state).
                           super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                           ._M_elems[local_440].sent_announce == true)) &&
                         (iVar23 = (paVar38->state).
                                   super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                                   ._M_elems[local_440].tier, this = local_470,
                         (int)(uint)local_448->tier <= iVar23 && iVar23 != 0x7fffffff))
                      goto LAB_00315325;
                    }
                    if (((paVar38->state).
                         super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                         ._M_elems[local_440].tier < (int)(uint)local_448->tier) &&
                       ((paVar38->state).
                        super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                        ._M_elems[local_440].sent_announce == true)) {
                      iVar23 = (*(((local_470->super_torrent_hot_members).m_ses)->
                                 super_session_logger)._vptr_session_logger[0x2e])();
                      tl.
                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)(CONCAT44(extraout_var_09,iVar23) + 0x438);
                      tl.
                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._0_1_ = 0;
                      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
                      tl.
                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._0_1_ = 1;
                      uVar22 = *(uint *)(CONCAT44(extraout_var_09,iVar23) + 0x428);
                      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
                      this = local_470;
                      if ((uVar22 >> 0x11 & 1) == 0) goto LAB_00315325;
                    }
                    if ((*(undefined1 *)((long)(this_00 + 2) + 4) & 0x7f) == 0) {
                      (paVar38->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[local_440].tier = (uint)local_448->tier;
                      (paVar38->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[local_440].sent_announce = false;
                    }
                    bVar20 = is_seed(local_470);
                    bVar20 = announce_infohash::can_announce
                                       ((announce_infohash *)this_00,
                                        (time_point)((long)(int)now.__d.__r * 1000000000),bVar20,
                                        local_448->fail_limit);
                    ptVar33 = local_470;
                    if (bVar20) {
                      req.event = e;
                      if (e == none) {
                        eVar28 = started;
                        if ((*(uint *)((long)(this_00 + 2) + 4) >> 8 & 1) == 0) {
LAB_00314b8d:
                          req.event = eVar28;
                        }
                        else if (((*(uint *)((long)(this_00 + 2) + 4) >> 9 & 1) == 0) &&
                                ((local_470->field_0x606 & 0x40) == 0)) {
                          bVar20 = is_seed(local_470);
                          eVar28 = completed;
                          if (bVar20) goto LAB_00314b8d;
                        }
                      }
                      req.triggered_manually =
                           (bool)((byte)((ushort)*(undefined2 *)((long)(this_00 + 2) + 4) >> 10) & 1
                                 );
                      *(undefined1 *)((long)(this_00 + 2) + 5) =
                           *(undefined1 *)((long)(this_00 + 2) + 5) & 0xfb;
                      uVar24 = tracker_key(ptVar33);
                      req.key = uVar24;
                      peVar10 = (this_01->socket).m_sock.
                                super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr;
                      req.outgoing_socket.m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._0_2_ = SUB82(peVar10,0);
                      req.outgoing_socket.m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._2_6_ = (undefined6)((ulong)peVar10 >> 0x10);
                      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                                (&req.outgoing_socket.m_sock.
                                  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,__r);
                      peVar9 = (local_470->super_torrent_hot_members).m_torrent_file.
                               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr;
                      lVar29 = 0x14;
                      if (ih == V1) {
                        lVar29 = 0;
                      }
                      puVar4 = (uint *)((long)(peVar9->m_info_hash).v1.m_number._M_elems + lVar29);
                      req.info_hash.m_number._M_elems._0_8_ = *(undefined8 *)puVar4;
                      req.info_hash.m_number._M_elems._8_8_ = *(undefined8 *)(puVar4 + 2);
                      req.info_hash.m_number._M_elems[4] =
                           *(uint *)((long)(peVar9->m_info_hash).v1.m_number._M_elems +
                                    lVar29 + 0x10);
                      iVar23 = (*(local_470->super_request_callback)._vptr_request_callback[6])();
                      pcVar19 = req.ssl_ctx;
                      _Var18 = req.url._M_dataplus;
                      if ((char)iVar23 != '\0') {
                        pcVar35 = "";
                        if (req.event == started) {
                          pcVar35 = "started";
                        }
                        if (req.event == stopped) {
                          pcVar35 = "stopped";
                        }
                        uVar22 = *(uint *)&(local_470->super_torrent_hot_members).field_0x48;
                        iVar23 = (*(((local_470->super_torrent_hot_members).m_ses)->
                                   super_session_logger)._vptr_session_logger[0x20])();
                        uVar25 = (*(((local_470->super_torrent_hot_members).m_ses)->
                                   super_session_logger)._vptr_session_logger[0x21])();
                        uVar6 = *(ushort *)((long)(this_00 + 2) + 4);
                        print_endpoint_abi_cxx11_((string *)&tl,(aux *)this_01,ep_00);
                        (*(local_470->super_request_callback)._vptr_request_callback[7])
                                  (local_470,
                                   "==> TRACKER REQUEST \"%s\" event: %s abort: %d ssl: %p port: %d ssl-port: %d fails: %d upd: %d ep: %s"
                                   ,_Var18._M_p,pcVar35,(ulong)(uVar22 >> 0x1a & 1),pcVar19,
                                   (short)iVar23,(ulong)(uVar25 & 0xffff),(ulong)(uVar6 & 0x7f),
                                   (ulong)(uVar6 >> 7 & 1),
                                   tl.
                                   super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)tl.
                               super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr != &local_458) {
                          operator_delete(tl.
                                          super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr,local_458._M_allocated_capacity + 1);
                        }
                      }
                      if (((local_470->super_torrent_hot_members).field_0x4b & 4) == 0) {
LAB_00314e8a:
                        psVar11 = (local_470->super_torrent_hot_members).m_ses;
                        tracker_request::tracker_request((tracker_request *)local_240,&req);
                        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr<libtorrent::aux::torrent,void>
                                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>
                                    *)&tl,local_390);
                        ptVar33 = local_470;
                        local_3b0 = (long *)CONCAT71(tl.
                                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi._1_7_,
                                                  tl.
                                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi._0_1_);
                        local_3b8 = tl.
                                    super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr;
                        if (local_3b0 != (long *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            *(int *)((long)local_3b0 + 0xc) = *(int *)((long)local_3b0 + 0xc) + 1;
                            UNLOCK();
                          }
                          else {
                            *(int *)((long)local_3b0 + 0xc) = *(int *)((long)local_3b0 + 0xc) + 1;
                          }
                        }
                        (*(psVar11->super_session_logger)._vptr_session_logger[0x2f])
                                  (psVar11,local_240,&local_3b8);
                        if (local_3b0 != (long *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            piVar2 = (int *)((long)local_3b0 + 0xc);
                            iVar23 = *piVar2;
                            *piVar2 = *piVar2 + -1;
                            UNLOCK();
                          }
                          else {
                            iVar23 = *(int *)((long)local_3b0 + 0xc);
                            *(int *)((long)local_3b0 + 0xc) = iVar23 + -1;
                          }
                          if (iVar23 == 1) {
                            (**(code **)(*local_3b0 + 0x18))();
                          }
                        }
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            CONCAT71(tl.
                                     super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._1_7_,
                                     tl.
                                     super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._0_1_) !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     CONCAT71(tl.
                                              super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi._1_7_,
                                              tl.
                                              super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi._0_1_));
                        }
                        if (local_158._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                        {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            p_Var1 = &(local_158._M_pi)->_M_weak_count;
                            iVar23 = *p_Var1;
                            *p_Var1 = *p_Var1 + -1;
                            UNLOCK();
                          }
                          else {
                            iVar23 = (local_158._M_pi)->_M_weak_count;
                            (local_158._M_pi)->_M_weak_count = iVar23 + -1;
                          }
                          if (iVar23 == 1) {
                            (*(local_158._M_pi)->_vptr__Sp_counted_base[3])();
                          }
                        }
                        if ((anon_struct_8_0_00000001_for___align)local_240._160_8_ !=
                            (anon_struct_8_0_00000001_for___align)0x0) {
                          operator_delete((void *)local_240._160_8_,
                                          (long)local_190 - local_240._160_8_);
                        }
                        if ((pointer)local_240._136_8_ != (pointer)0x0) {
                          operator_delete((void *)local_240._136_8_,
                                          local_240._152_8_ - local_240._136_8_);
                        }
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._72_8_ !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     local_240._72_8_);
                        }
                        if ((undefined1 *)local_240._32_8_ != local_240 + 0x30) {
                          operator_delete((void *)local_240._32_8_,local_240._48_8_ + 1);
                        }
                        if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
                          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
                        }
                      }
                      else {
                        iVar23 = (**(((local_470->super_torrent_hot_members).m_ses)->
                                    super_session_logger)._vptr_session_logger)();
                        ptVar33 = local_470;
                        if ((char)iVar23 == '\0') goto LAB_00314e8a;
                        tl.
                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = (element_type *)0x0;
                        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                        __shared_count<libtorrent::aux::tracker_logger,std::allocator<libtorrent::aux::tracker_logger>,libtorrent::aux::session_interface&>
                                  (&tl.
                                    super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,(tracker_logger **)&tl,
                                   (allocator<libtorrent::aux::tracker_logger> *)local_378,
                                   (local_470->super_torrent_hot_members).m_ses);
                        psVar11 = (ptVar33->super_torrent_hot_members).m_ses;
                        tracker_request::tracker_request(&local_138,&req);
                        local_3a0 = (long *)CONCAT71(tl.
                                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi._1_7_,
                                                  tl.
                                                  super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi._0_1_);
                        local_3a8 = tl.
                                    super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr;
                        if (local_3a0 != (long *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            *(int *)((long)local_3a0 + 0xc) = *(int *)((long)local_3a0 + 0xc) + 1;
                            UNLOCK();
                          }
                          else {
                            *(int *)((long)local_3a0 + 0xc) = *(int *)((long)local_3a0 + 0xc) + 1;
                          }
                        }
                        (*(psVar11->super_session_logger)._vptr_session_logger[0x2f])
                                  (psVar11,&local_138,&local_3a8);
                        if (local_3a0 != (long *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            piVar2 = (int *)((long)local_3a0 + 0xc);
                            iVar23 = *piVar2;
                            *piVar2 = *piVar2 + -1;
                            UNLOCK();
                          }
                          else {
                            iVar23 = *(int *)((long)local_3a0 + 0xc);
                            *(int *)((long)local_3a0 + 0xc) = iVar23 + -1;
                          }
                          if (iVar23 == 1) {
                            (**(code **)(*local_3a0 + 0x18))();
                          }
                        }
                        if (local_138.outgoing_socket.m_sock.
                            super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            p_Var1 = &(local_138.outgoing_socket.m_sock.
                                       super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi)->_M_weak_count;
                            iVar23 = *p_Var1;
                            *p_Var1 = *p_Var1 + -1;
                            UNLOCK();
                          }
                          else {
                            iVar23 = (local_138.outgoing_socket.m_sock.
                                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_weak_count;
                            (local_138.outgoing_socket.m_sock.
                             super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)->_M_weak_count = iVar23 + -1;
                          }
                          if (iVar23 == 1) {
                            (*(local_138.outgoing_socket.m_sock.
                               super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
                          }
                        }
                        if (local_138.ipv4.
                            super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_138.ipv4.
                                          super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_138.ipv4.
                                                super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_138.ipv4.
                                                super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (local_138.ipv6.
                            super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_138.ipv6.
                                          super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_138.ipv6.
                                                super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_138.ipv6.
                                                super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (local_138.filter.
                            super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (local_138.filter.
                                     super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138.trackerid._M_dataplus._M_p != &local_138.trackerid.field_2)
                        {
                          operator_delete(local_138.trackerid._M_dataplus._M_p,
                                          local_138.trackerid.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_138.url._M_dataplus._M_p != &local_138.url.field_2) {
                          operator_delete(local_138.url._M_dataplus._M_p,
                                          local_138.url.field_2._M_allocated_capacity + 1);
                        }
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            CONCAT71(tl.
                                     super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._1_7_,
                                     tl.
                                     super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi._0_1_) !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     CONCAT71(tl.
                                              super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi._1_7_,
                                              tl.
                                              super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi._0_1_));
                        }
                      }
                      *(undefined1 *)((long)(this_00 + 2) + 4) =
                           *(undefined1 *)((long)(this_00 + 2) + 4) | 0x80;
                      (((time_point32 *)((error_code *)(this_00 + 1) + 1))->__d).__r =
                           (rep_conflict)now.__d.__r;
                      ((time_point32 *)((error_code *)(this_00 + 1) + 1))[1].__d.__r =
                           (rep_conflict)now.__d.__r;
                      iVar23 = (*(((ptVar33->super_torrent_hot_members).m_ses)->super_session_logger
                                 )._vptr_session_logger[5])();
                      this = local_470;
                      if ((*(uint *)(CONCAT44(extraout_var_12,iVar23) + 0x68) & 0x10) != 0) {
                        iVar23 = (*(((local_470->super_torrent_hot_members).m_ses)->
                                   super_session_logger)._vptr_session_logger[5])();
                        this = local_470;
                        get_handle((torrent *)local_378);
                        alert_manager::
                        emplace_alert<libtorrent::tracker_announce_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,std::__cxx11::string&,libtorrent::protocol_version_const&,libtorrent::event_t&>
                                  ((alert_manager *)CONCAT44(extraout_var_13,iVar23),
                                   (torrent_handle *)local_378,&this_01->local_endpoint,&req.url,&ih
                                   ,&req.event);
                        if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             )local_378._8_8_ !=
                            (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             )0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            piVar2 = (int *)(local_378._8_8_ + 0xc);
                            iVar23 = *piVar2;
                            *piVar2 = *piVar2 + -1;
                            UNLOCK();
                          }
                          else {
                            iVar23 = *(int *)(local_378._8_8_ + 0xc);
                            *(int *)(local_378._8_8_ + 0xc) = iVar23 + -1;
                          }
                          if (iVar23 == 1) {
                            (**(code **)(*(long *)local_378._8_8_ + 0x18))();
                          }
                        }
                      }
                      (paVar38->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[local_440].sent_announce = true;
                      if ((*(undefined1 *)((long)(this_00 + 2) + 4) & 0x7f) == 0) {
                        iVar23 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)
                                   ._vptr_session_logger[0x2e])();
                        tl.
                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = (element_type *)(CONCAT44(extraout_var_14,iVar23) + 0x438);
                        tl.
                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._0_1_ = 0;
                        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
                        tl.
                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._0_1_ = 1;
                        uVar22 = *(uint *)(CONCAT44(extraout_var_14,iVar23) + 0x428);
                        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl)
                        ;
                        this = local_470;
                        if ((uVar22 >> 0x12 & 1) == 0) {
                          iVar23 = (*(((local_470->super_torrent_hot_members).m_ses)->
                                     super_session_logger)._vptr_session_logger[0x2e])();
                          lVar29 = CONCAT44(extraout_var_15,iVar23);
                          tl.
                          super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr = (element_type *)(lVar29 + 0x438);
                          tl.
                          super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._0_1_ = 0;
                          ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
LAB_003152ef:
                          tl.
                          super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._0_1_ = 1;
                          uVar22 = *(uint *)(lVar29 + 0x428);
                          ::std::unique_lock<std::mutex>::~unique_lock
                                    ((unique_lock<std::mutex> *)&tl);
                          this = local_470;
                          if ((uVar22 >> 0x11 & 1) == 0) {
                            (paVar38->state).
                            super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                            ._M_elems[local_440].done = true;
                          }
                        }
                      }
                    }
                    else {
                      this = local_470;
                      if ((*(undefined1 *)((long)(this_00 + 2) + 4) & 0x7f) == 0) {
                        (paVar38->state).
                        super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                        ._M_elems[local_440].sent_announce = true;
                        iVar23 = (*(((local_470->super_torrent_hot_members).m_ses)->
                                   super_session_logger)._vptr_session_logger[0x2e])();
                        tl.
                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = (element_type *)(CONCAT44(extraout_var_10,iVar23) + 0x438);
                        tl.
                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._0_1_ = 0;
                        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
                        tl.
                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._0_1_ = 1;
                        uVar22 = *(uint *)(CONCAT44(extraout_var_10,iVar23) + 0x428);
                        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl)
                        ;
                        this = local_470;
                        if ((uVar22 >> 0x12 & 1) == 0) {
                          iVar23 = (*(((local_470->super_torrent_hot_members).m_ses)->
                                     super_session_logger)._vptr_session_logger[0x2e])();
                          lVar29 = CONCAT44(extraout_var_11,iVar23);
                          tl.
                          super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr = (element_type *)(lVar29 + 0x438);
                          tl.
                          super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._0_1_ = 0;
                          ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
                          goto LAB_003152ef;
                        }
                      }
                    }
LAB_00315325:
                    lVar39 = lVar39 + 1;
                  } while (lVar39 != 2);
                }
                this_01 = this_01 + 1;
              } while (this_01 != local_388);
            }
            tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)
                     CONCAT62(tl.
                              super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr._2_6_,supports_protocol.super_array<const_bool,_2UL>._M_elems)
            ;
            uVar36 = (long)listen_socket_states.
                           super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)listen_socket_states.
                           super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            paVar31 = listen_socket_states.
                      super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (0 < (long)uVar36 >> 7) {
              paVar30 = (pointer)((long)&(((announce_state *)
                                          (&(listen_socket_states.
                                             super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->state + -1)
                                          )->socket).m_sock.
                                         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (uVar36 & 0xffffffffffffff80));
              lVar39 = (long)uVar36 >> 7;
              do {
                lVar29 = 0;
                do {
                  if ((*(char *)((long)&tl.
                                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr +
                                (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                             [lVar29]) == '\x01') &&
                     ((paVar31->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar29]].
                      done != true)) goto LAB_003154d0;
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 2);
                lVar29 = 0;
                do {
                  if ((*(char *)((long)&tl.
                                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr +
                                (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                             [lVar29]) == '\x01') &&
                     (paVar31[1].state.
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar29]].
                      done != true)) {
                    paVar31 = paVar31 + 1;
                    goto LAB_003154d0;
                  }
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 2);
                lVar29 = 0;
                do {
                  if ((*(char *)((long)&tl.
                                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr +
                                (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                             [lVar29]) == '\x01') &&
                     (paVar31[2].state.
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar29]].
                      done != true)) {
                    paVar31 = paVar31 + 2;
                    goto LAB_003154d0;
                  }
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 2);
                lVar29 = 0;
                do {
                  if ((*(char *)((long)&tl.
                                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr +
                                (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                             [lVar29]) == '\x01') &&
                     (paVar31[3].state.
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar29]].
                      done != true)) {
                    paVar31 = paVar31 + 3;
                    goto LAB_003154d0;
                  }
                  lVar29 = lVar29 + 1;
                } while (lVar29 != 2);
                paVar31 = paVar31 + 4;
                bVar20 = 1 < lVar39;
                lVar39 = lVar39 + -1;
              } while (bVar20);
              uVar36 = (long)listen_socket_states.
                             super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)paVar30;
              paVar31 = paVar30;
            }
            lVar39 = (long)uVar36 >> 5;
            if (lVar39 != 1) {
              if (lVar39 != 2) {
                if (lVar39 != 3) break;
                lVar39 = 0;
                do {
                  if ((*(char *)((long)&tl.
                                        super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr +
                                (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                             [lVar39]) == '\x01') &&
                     ((paVar31->state).
                      super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                      ._M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar39]].
                      done != true)) goto LAB_003154d0;
                  lVar39 = lVar39 + 1;
                } while (lVar39 != 2);
                paVar31 = paVar31 + 1;
              }
              lVar39 = 0;
              do {
                if ((*(char *)((long)&tl.
                                      super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr +
                              (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)
                                           [lVar39]) == '\x01') &&
                   ((paVar31->state).
                    super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                    ._M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar39]].done
                    != true)) goto LAB_003154d0;
                lVar39 = lVar39 + 1;
              } while (lVar39 != 2);
              paVar31 = paVar31 + 1;
            }
            lVar39 = 0;
            while ((*(char *)((long)&tl.
                                     super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr +
                             (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar39]
                             ) != '\x01' ||
                   ((paVar31->state).
                    super_array<libtorrent::aux::(anonymous_namespace)::announce_protocol_state,_2UL>
                    ._M_elems[(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar39]].done
                    == true))) {
              lVar39 = lVar39 + 1;
              if (lVar39 == 2) goto LAB_003154eb;
            }
LAB_003154d0:
            if (paVar31 ==
                listen_socket_states.
                super__Vector_base<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
                ._M_impl.super__Vector_impl_data._M_finish) break;
          }
          else {
            if (-1 < (char)this->field_0x5cc) goto LAB_0031459f;
            iVar23 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[0x2e])();
            tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)(CONCAT44(extraout_var_06,iVar23) + 0x438);
            tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._0_1_ = 0;
            ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&tl);
            tl.super___shared_ptr<libtorrent::aux::tracker_logger,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._0_1_ = 1;
            uVar22 = *(uint *)(CONCAT44(extraout_var_06,iVar23) + 0x428);
            ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&tl);
            if ((uVar22 >> 0x17 & 1) != 0) goto LAB_0031459f;
          }
          local_448 = (announce_entry *)(local_448->list_hook).super_type.super_type.next_;
        } while (local_448 != (announce_entry *)phVar3);
      }
LAB_003154eb:
      update_tracker_timer(this,now);
      ::std::
      vector<libtorrent::aux::(anonymous_namespace)::announce_state,_std::allocator<libtorrent::aux::(anonymous_namespace)::announce_state>_>
      ::~vector(&listen_socket_states);
      plVar15 = (long *)CONCAT62(req.outgoing_socket.m_sock.
                                 super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._2_6_,
                                 req.outgoing_socket.m_sock.
                                 super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._0_2_);
      if (plVar15 != (long *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar2 = (int *)((long)plVar15 + 0xc);
          iVar23 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
        }
        else {
          iVar23 = *(int *)((long)plVar15 + 0xc);
          *(int *)((long)plVar15 + 0xc) = iVar23 + -1;
        }
        if (iVar23 == 1) {
          (**(code **)(*plVar15 + 0x18))();
        }
      }
      if (req.ipv4.
          super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(req.ipv4.
                        super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)req.ipv4.
                              super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)req.ipv4.
                              super__Vector_base<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (req.ipv6.
          super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(req.ipv6.
                        super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)req.ipv6.
                              super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)req.ipv6.
                              super__Vector_base<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (req.filter.super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (req.filter.
                   super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)req.trackerid._M_dataplus._M_p != &req.trackerid.field_2) {
        operator_delete(req.trackerid._M_dataplus._M_p,
                        CONCAT71(req.trackerid.field_2._M_allocated_capacity._1_7_,
                                 req.trackerid.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)req.url._M_dataplus._M_p != &req.url.field_2) {
        operator_delete(req.url._M_dataplus._M_p,
                        CONCAT71(req.url.field_2._M_allocated_capacity._1_7_,
                                 req.url.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
    if ((this->field_0x5c0 & 1) == 0) {
      UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
      pcVar35 = "*** announce: event != stopped && !m_announce_to_trackers";
    }
    else {
      if ((uVar22 >> 0x1b & 1) == 0) {
        if (e == none) {
          bVar20 = is_finished(this);
          if (bVar20) {
            bVar20 = is_seed(this);
            e = !bVar20 << 2;
          }
          else {
            e = none;
          }
        }
        goto LAB_0031401d;
      }
      UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
      pcVar35 = "*** announce: event != stopped && m_paused";
    }
  }
  (*UNRECOVERED_JUMPTABLE)(this,pcVar35);
  return;
}

Assistant:

void torrent::announce_with_tracker(event_t e)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(e == event_t::stopped || state() != torrent_status::checking_files);
		INVARIANT_CHECK;

		if (m_trackers.empty())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: no trackers");
#endif
			return;
		}

		if (m_abort) e = event_t::stopped;

		// having stop_tracker_timeout <= 0 means that there is
		// no need to send any request to trackers or trigger any
		// related logic when the event is stopped
		if (e == event_t::stopped
			&& settings().get_int(settings_pack::stop_tracker_timeout) <= 0)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: event == stopped && stop_tracker_timeout <= 0");
#endif
			return;
		}

		// if we're not announcing to trackers, only allow
		// stopping
		if (e != event_t::stopped && !m_announce_to_trackers)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: event != stopped && !m_announce_to_trackers");
#endif
			return;
		}

		// if we're not allowing peers, there's no point in announcing
		if (e != event_t::stopped && m_paused)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("*** announce: event != stopped && m_paused");
#endif
			return;
		}

		TORRENT_ASSERT(!m_paused || e == event_t::stopped);

		if (e == event_t::none && is_finished() && !is_seed())
			e = event_t::paused;

		tracker_request req;
		if (settings().get_bool(settings_pack::apply_ip_filter_to_trackers)
			&& m_apply_ip_filter)
		{
			req.filter = m_ip_filter;
		}

		req.private_torrent = m_torrent_file->priv();

		req.pid = m_peer_id;
		req.downloaded = m_stat.total_payload_download() - m_total_failed_bytes;
		req.uploaded = m_stat.total_payload_upload();
		req.corrupt = m_total_failed_bytes;
		req.left = bytes_left().value_or(16 * 1024);
#ifdef TORRENT_SSL_PEERS
		// if this torrent contains an SSL certificate, make sure
		// any SSL tracker presents a certificate signed by it
		req.ssl_ctx = m_ssl_ctx.get();
#endif

		req.redundant = m_total_redundant_bytes;
		// exclude redundant bytes if we should
		if (!settings().get_bool(settings_pack::report_true_downloaded))
		{
			req.downloaded -= m_total_redundant_bytes;

			// if the torrent is complete we know that all incoming pieces will be
			// marked redundant so add them to the redundant count
			// this is mainly needed to cover the case where a torrent has just completed
			// but still has partially downloaded pieces
			// if the incoming pieces are not accounted for it could cause the downloaded
			// amount to exceed the total size of the torrent which upsets some trackers
			if (is_seed())
			{
				for (auto const& c : m_connections)
				{
					TORRENT_INCREMENT(m_iterating_connections);
					auto const pbp = c->downloading_piece_progress();
					if (pbp.bytes_downloaded > 0)
					{
						req.downloaded -= pbp.bytes_downloaded;
						req.redundant += pbp.bytes_downloaded;
					}
				}
			}
		}
		if (req.downloaded < 0) req.downloaded = 0;

		req.event = e;

		// since sending our IPv4/v6 address to the tracker may be sensitive. Only
		// do that if we're not in anonymous mode and if it's a private torrent
		if (!settings().get_bool(settings_pack::anonymous_mode)
			&& m_torrent_file
			&& m_torrent_file->priv())
		{
			m_ses.for_each_listen_socket([&](aux::listen_socket_handle const& s)
			{
				if (s.is_ssl() != is_ssl_torrent()) return;
				tcp::endpoint const ep = s.get_local_endpoint();
				if (ep.address().is_unspecified()) return;
				if (aux::is_v6(ep))
				{
					if (!aux::is_local(ep.address()) && !ep.address().is_loopback())
						req.ipv6.push_back(ep.address().to_v6());
				}
				else
				{
					if (!aux::is_local(ep.address()) && !ep.address().is_loopback())
						req.ipv4.push_back(ep.address().to_v4());
				}
			});
		}

		// if we are aborting. we don't want any new peers
		req.num_want = (req.event == event_t::stopped)
			? 0 : settings().get_int(settings_pack::num_want);

// some older versions of clang had a bug where it would fire this warning here
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-braces"
#endif
		aux::array<bool const, num_protocols, protocol_version> const supports_protocol
		{ {
			m_info_hash.has_v1(),
			m_info_hash.has_v2()
		} };
#ifdef __clang__
#pragma clang diagnostic pop
#endif

		time_point32 const now = aux::time_now32();

		// each listen socket gets its own announce state
		// so that each one should get at least one announce
		std::vector<announce_state> listen_socket_states;

#ifndef TORRENT_DISABLE_LOGGING
		int idx = -1;
		if (should_log())
		{
			debug_log("*** announce: "
				"[ announce_to_all_tiers: %d announce_to_all_trackers: %d num_trackers: %d ]"
				, settings().get_bool(settings_pack::announce_to_all_tiers)
				, settings().get_bool(settings_pack::announce_to_all_trackers)
				, int(m_trackers.size()));
		}
#endif

		// TODO: it would be nice to raise the abstraction level of the
		// tracker_list or trackers a bit here
		for (auto& ae : m_trackers)
		{
#ifndef TORRENT_DISABLE_LOGGING
			++idx;
#endif
			refresh_endpoint_list(m_ses, is_ssl_torrent(), bool(m_complete_sent), ae);

			// if trackerid is not specified for tracker use default one, probably set explicitly
			req.trackerid = ae.trackerid.empty() ? m_trackerid : ae.trackerid;
			req.url = ae.url;

#if TORRENT_USE_I2P
			if (is_i2p_url(req.url))
			{
				req.kind |= tracker_request::i2p;
			}
			else if (is_i2p() && !settings().get_bool(settings_pack::allow_i2p_mixed))
			{
				// if we don't allow mixing normal peers into this i2p
				// torrent, skip this announce
				continue;
			}
#endif

			for (auto& aep : ae.endpoints)
			{
				// do not add code which continues to the next endpoint here!
				// listen_socket_states needs to be populated even if none of the endpoints
				// will be announcing for this tracker
				// otherwise the early bail out when neither announce_to_all_trackers
				// nor announce_to_all_tiers is set may be triggered prematurely

				auto aep_state_iter = std::find_if(listen_socket_states.begin(), listen_socket_states.end()
					, [&](announce_state const& s) { return s.socket == aep.socket; });
				if (aep_state_iter == listen_socket_states.end())
				{
					listen_socket_states.emplace_back(aep.socket);
					aep_state_iter = listen_socket_states.end() - 1;
				}
				announce_state& ep_state = *aep_state_iter;

				if (!aep.enabled) continue;

				for (protocol_version const ih : all_versions)
				{
					if (!supports_protocol[ih]) continue;

					auto& state = ep_state.state[ih];
					auto& a = aep.info_hashes[ih];

					// if we haven't sent an event=start to the tracker, there's no
					// point in sending an event=stopped
					if (!a.start_sent && req.event == event_t::stopped)
						continue;

					if (state.done) continue;

#ifndef TORRENT_DISABLE_LOGGING
					if (should_log())
					{
						debug_log("*** tracker:  (%d) [ep: %s ] \"%s\" [ "
							" i->tier: %d tier: %d working: %d limit: %d"
							" can: %d sent: %d ]"
							, idx, print_endpoint(aep.local_endpoint).c_str()
							, ae.url.c_str(), ae.tier, state.tier, a.is_working(), ae.fail_limit
							, a.can_announce(now, is_seed(), ae.fail_limit), state.sent_announce);
					}
#endif

					if (settings().get_bool(settings_pack::announce_to_all_tiers)
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& state.sent_announce
						&& ae.tier <= state.tier
						&& state.tier != INT_MAX)
						continue;

					if (ae.tier > state.tier && state.sent_announce
						&& !settings().get_bool(settings_pack::announce_to_all_tiers)) continue;
					if (a.is_working()) { state.tier = ae.tier; state.sent_announce = false; }
					if (!a.can_announce(now, is_seed(), ae.fail_limit))
					{
						// this counts
						if (a.is_working())
						{
							state.sent_announce = true;
							if (!settings().get_bool(settings_pack::announce_to_all_trackers)
								&& !settings().get_bool(settings_pack::announce_to_all_tiers))
							{
								state.done = true;
							}
						}
						continue;
					}

					req.event = e;
					if (req.event == event_t::none)
					{
						if (!a.start_sent) req.event = event_t::started;
						else if (!m_complete_sent
							&& !a.complete_sent
							&& is_seed())
						{
							req.event = event_t::completed;
						}
					}

					req.triggered_manually = a.triggered_manually;
					a.triggered_manually = false;

#if TORRENT_ABI_VERSION == 1
					req.auth = tracker_login();
#endif
					req.key = tracker_key();

					req.outgoing_socket = aep.socket;
					req.info_hash = m_torrent_file->info_hashes().get(ih);

#ifndef TORRENT_DISABLE_LOGGING
					if (should_log())
					{
						debug_log("==> TRACKER REQUEST \"%s\" event: %s abort: %d ssl: %p "
							"port: %d ssl-port: %d fails: %d upd: %d ep: %s"
							, req.url.c_str()
							, (req.event == event_t::stopped ? "stopped"
								: req.event == event_t::started ? "started" : "")
							, m_abort
#ifdef TORRENT_SSL_PEERS
							, static_cast<void*>(req.ssl_ctx)
#else
							, static_cast<void*>(nullptr)
#endif
							, m_ses.listen_port()
							, m_ses.ssl_listen_port()
							, a.fails
							, a.updating
							, print_endpoint(aep.local_endpoint).c_str());
					}

					// if we're not logging session logs, don't bother creating an
					// observer object just for logging
					if (m_abort && m_ses.should_log())
					{
						auto tl = std::make_shared<aux::tracker_logger>(m_ses);
						m_ses.queue_tracker_request(req, tl);
					}
					else
#endif
					{
						m_ses.queue_tracker_request(req, shared_from_this());
					}

					a.updating = true;
					a.next_announce = now;
					a.min_announce = now;

					if (m_ses.alerts().should_post<tracker_announce_alert>())
					{
						m_ses.alerts().emplace_alert<tracker_announce_alert>(
							get_handle(), aep.local_endpoint, req.url, ih, req.event);
					}

					state.sent_announce = true;
					if (a.is_working()
						&& !settings().get_bool(settings_pack::announce_to_all_trackers)
						&& !settings().get_bool(settings_pack::announce_to_all_tiers))
					{
						state.done = true;
					}
				}
			}

			if (std::all_of(listen_socket_states.begin(), listen_socket_states.end()
				, [supports_protocol](announce_state const& s) {
					for (protocol_version const ih : all_versions)
					{
						if (supports_protocol[ih] && !s.state[ih].done)
							return false;
					}
					return true;
				}))
				break;
		}
		update_tracker_timer(now);
	}